

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O3

bool __thiscall
MC::MC_Driver::addColunm(MC_Driver *this,string *colunmName,int attributype,int constraint)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator iVar3;
  pointer pcVar4;
  iterator iVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  TableInfo *pTVar9;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  int local_88;
  int local_84;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  local_88 = constraint;
  local_84 = attributype;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->tableInfo->getID)._M_t,colunmName);
  pTVar9 = this->tableInfo;
  if ((_Rb_tree_header *)iVar5._M_node != &(pTVar9->getID)._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"duplicate colunm ",0x11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(colunmName->_M_dataplus)._M_p,
                        colunmName->_M_string_length);
    lVar7 = *(long *)poVar6;
LAB_00115618:
    std::ios::widen((char)*(undefined8 *)(lVar7 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    return false;
  }
  if (0x1f < pTVar9->attributeNum) {
    poVar6 = (ostream *)&std::cout;
    pcVar8 = "exceed maximum number of attribute\n";
    lVar7 = 0x23;
    goto LAB_00115720;
  }
  if (attributype < 0x1d4c1) {
    if ((attributype == 50000) || (attributype == 90000)) goto LAB_001156a3;
    pcVar8 = "attributetype of ";
    lVar7 = 0x11;
  }
  else {
    if (0x1d5bf < (uint)attributype) {
      poVar6 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"length of char type can not be longer than 255",0x2e);
      lVar7 = std::cout;
      goto LAB_00115618;
    }
LAB_001156a3:
    if ((uint)constraint < 4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pTVar9->attributeName,colunmName);
      pTVar9 = this->tableInfo;
      iVar3._M_current =
           (pTVar9->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pTVar9->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&pTVar9->type,iVar3,&local_84);
        pTVar9 = this->tableInfo;
      }
      else {
        *iVar3._M_current = attributype;
        (pTVar9->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar3._M_current + 1;
      }
      iVar3._M_current =
           (pTVar9->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pTVar9->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&pTVar9->constraint,iVar3,&local_88);
        pTVar9 = this->tableInfo;
      }
      else {
        *iVar3._M_current = constraint;
        (pTVar9->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      paVar2 = &local_58.first.field_2;
      pcVar4 = (colunmName->_M_dataplus)._M_p;
      local_58.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar4,pcVar4 + colunmName->_M_string_length);
      local_58.second = pTVar9->attributeNum;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,int>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  *)&this->tableInfo->getID,&local_58);
      if (local_88 == 3) {
        local_80._0_4_ = this->tableInfo->attributeNum;
        this->tableInfo->primary_key_id = local_80._0_4_;
        pcVar4 = (colunmName->_M_dataplus)._M_p;
        local_78._M_p = (pointer)&local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar4,pcVar4 + colunmName->_M_string_length);
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<int,std::__cxx11::string>&>
                  ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    *)&this->tableInfo->indexInfo,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
      }
      piVar1 = &this->tableInfo->attributeNum;
      *piVar1 = *piVar1 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
    pcVar8 = "attribute constraint of ";
    lVar7 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar7);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(colunmName->_M_dataplus)._M_p,
                      colunmName->_M_string_length);
  pcVar8 = " unrecognized\n";
  lVar7 = 0xe;
LAB_00115720:
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,lVar7);
  return false;
}

Assistant:

bool MC::MC_Driver::addColunm(std::string colunmName,int attributype,int constraint){
    //是否重名
    auto it = tableInfo->getID.find(colunmName);
    if(it!=tableInfo->getID.end()){
        std::cout<<"duplicate colunm "<<colunmName<<std::endl;
        return false;
    }
    //是否超过最大属性数目
    if(tableInfo->attributeNum >= 32){
        std::cout<<"exceed maximum number of attribute\n";
        return false;
    }
    
    //检查类型是否没有错误
    if(attributype == 50000 || attributype == 90000 || attributype > 120000){
        if(attributype - 120000 > 255){
            //长度太长
            std::cout<<"length of char type can not be longer than 255"<<std::endl;
            return false;
        }
        //检查属性限制是否错误
        //0代表没有限制 1代表not null 2代表unique 3代表primary key
        if(constraint == 0 || constraint == 1 || constraint == 2 || constraint == 3){
            //类型和限制都没有错误
            tableInfo->attributeName.push_back(colunmName);
            tableInfo->type.push_back(attributype);
            tableInfo->constraint.push_back(constraint);
            std::pair<std::string,int> p = std::make_pair(colunmName,tableInfo->attributeNum);
            tableInfo->getID.insert(p);
            //如果是primary key需要加上它建立在的列的id
            if(constraint == 3){
                tableInfo->primary_key_id =  tableInfo->attributeNum;
                std::pair<int,std::string> p = std::make_pair(tableInfo->attributeNum, colunmName);
                tableInfo->indexInfo.insert(p);
            }
            tableInfo->attributeNum++;
            return true;
        }
        else{
            std::cout << "attribute constraint of " <<colunmName<<" unrecognized\n";
            return false;
        }
        //tableInfo->type_and_constraint.
    }else{
        //输入类型错误
        std::cout << "attributetype of " <<colunmName<<" unrecognized\n";
        return false;
    }
}